

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint32_t JenkinsOOAT_perl(char *key,int len,uint32_t hash)

{
  uint uVar1;
  uchar *end;
  uchar *str;
  uint32_t hash_local;
  int len_local;
  char *key_local;
  
  hash_local = hash;
  for (str = (uchar *)key; str < key + len; str = str + 1) {
    uVar1 = (*str + hash_local) * 0x401;
    hash_local = uVar1 >> 6 ^ uVar1;
  }
  return (hash_local * 9 >> 0xb ^ hash_local * 9) * 0x8001;
}

Assistant:

uint32_t JenkinsOOAT_perl(const char *key, int len, uint32_t hash)
{
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  while (str < end) {
    hash += *str++;
    hash += (hash << 10);
    hash ^= (hash >> 6);
  }
  hash += (hash << 3);
  hash ^= (hash >> 11);
  hash = hash + (hash << 15);
  return hash;
}